

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStyle::ImGuiStyle(ImGuiStyle *this)

{
  undefined4 *in_RDI;
  ImGuiStyle *in_stack_000002d0;
  ImVec4 *local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImVec2 local_10 [2];
  
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 1));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 5));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 7));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0xd));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x11));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x13));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x15));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x1f));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x21));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x23));
  local_60 = (ImVec4 *)(in_RDI + 0x28);
  do {
    ImVec4::ImVec4(local_60);
    local_60 = local_60 + 1;
  } while (local_60 != (ImVec4 *)(in_RDI + 0xe8));
  *in_RDI = 0x3f800000;
  ImVec2::ImVec2(local_10,8.0,8.0);
  *(ImVec2 *)(in_RDI + 1) = local_10[0];
  in_RDI[3] = 0x40e00000;
  in_RDI[4] = 0x3f800000;
  ImVec2::ImVec2(&local_18,32.0,32.0);
  *(ImVec2 *)(in_RDI + 5) = local_18;
  ImVec2::ImVec2(&local_20,0.0,0.5);
  *(ImVec2 *)(in_RDI + 7) = local_20;
  in_RDI[9] = 0;
  in_RDI[10] = 0x3f800000;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0x3f800000;
  ImVec2::ImVec2(&local_28,4.0,3.0);
  *(ImVec2 *)(in_RDI + 0xd) = local_28;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  ImVec2::ImVec2(&local_30,8.0,4.0);
  *(ImVec2 *)(in_RDI + 0x11) = local_30;
  ImVec2::ImVec2(&local_38,4.0,4.0);
  *(ImVec2 *)(in_RDI + 0x13) = local_38;
  ImVec2::ImVec2(&local_40,0.0,0.0);
  *(ImVec2 *)(in_RDI + 0x15) = local_40;
  in_RDI[0x17] = 0x41a80000;
  in_RDI[0x18] = 0x40c00000;
  in_RDI[0x19] = 0x41800000;
  in_RDI[0x1a] = 0x41100000;
  in_RDI[0x1b] = 0x41200000;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0x40800000;
  in_RDI[0x1e] = 0;
  ImVec2::ImVec2(&local_48,0.5,0.5);
  *(ImVec2 *)(in_RDI + 0x1f) = local_48;
  ImVec2::ImVec2(&local_50,19.0,19.0);
  *(ImVec2 *)(in_RDI + 0x21) = local_50;
  ImVec2::ImVec2(&local_58,3.0,3.0);
  *(ImVec2 *)(in_RDI + 0x23) = local_58;
  in_RDI[0x25] = 0x3f800000;
  *(undefined1 *)(in_RDI + 0x26) = 1;
  *(undefined1 *)((long)in_RDI + 0x99) = 1;
  in_RDI[0x27] = 0x3fa00000;
  ImGui::StyleColorsDark(in_stack_000002d0);
  return;
}

Assistant:

ImGuiStyle::ImGuiStyle()
{
    Alpha                   = 1.0f;             // Global alpha applies to everything in ImGui
    WindowPadding           = ImVec2(8,8);      // Padding within a window
    WindowRounding          = 7.0f;             // Radius of window corners rounding. Set to 0.0f to have rectangular windows
    WindowBorderSize        = 1.0f;             // Thickness of border around windows. Generally set to 0.0f or 1.0f. Other values not well tested.
    WindowMinSize           = ImVec2(32,32);    // Minimum window size
    WindowTitleAlign        = ImVec2(0.0f,0.5f);// Alignment for title bar text
    ChildRounding           = 0.0f;             // Radius of child window corners rounding. Set to 0.0f to have rectangular child windows
    ChildBorderSize         = 1.0f;             // Thickness of border around child windows. Generally set to 0.0f or 1.0f. Other values not well tested.
    PopupRounding           = 0.0f;             // Radius of popup window corners rounding. Set to 0.0f to have rectangular child windows
    PopupBorderSize         = 1.0f;             // Thickness of border around popup or tooltip windows. Generally set to 0.0f or 1.0f. Other values not well tested.
    FramePadding            = ImVec2(4,3);      // Padding within a framed rectangle (used by most widgets)
    FrameRounding           = 0.0f;             // Radius of frame corners rounding. Set to 0.0f to have rectangular frames (used by most widgets).
    FrameBorderSize         = 0.0f;             // Thickness of border around frames. Generally set to 0.0f or 1.0f. Other values not well tested.
    ItemSpacing             = ImVec2(8,4);      // Horizontal and vertical spacing between widgets/lines
    ItemInnerSpacing        = ImVec2(4,4);      // Horizontal and vertical spacing between within elements of a composed widget (e.g. a slider and its label)
    TouchExtraPadding       = ImVec2(0,0);      // Expand reactive bounding box for touch-based system where touch position is not accurate enough. Unfortunately we don't sort widgets so priority on overlap will always be given to the first widget. So don't grow this too much!
    IndentSpacing           = 21.0f;            // Horizontal spacing when e.g. entering a tree node. Generally == (FontSize + FramePadding.x*2).
    ColumnsMinSpacing       = 6.0f;             // Minimum horizontal spacing between two columns
    ScrollbarSize           = 16.0f;            // Width of the vertical scrollbar, Height of the horizontal scrollbar
    ScrollbarRounding       = 9.0f;             // Radius of grab corners rounding for scrollbar
    GrabMinSize             = 10.0f;            // Minimum width/height of a grab box for slider/scrollbar
    GrabRounding            = 0.0f;             // Radius of grabs corners rounding. Set to 0.0f to have rectangular slider grabs.
    TabRounding             = 4.0f;             // Radius of upper corners of a tab. Set to 0.0f to have rectangular tabs.
    TabBorderSize           = 0.0f;             // Thickness of border around tabs.
    ButtonTextAlign         = ImVec2(0.5f,0.5f);// Alignment of button text when button is larger than text.
    DisplayWindowPadding    = ImVec2(19,19);    // Window position are clamped to be visible within the display area by at least this amount. Only applies to regular windows.
    DisplaySafeAreaPadding  = ImVec2(3,3);      // If you cannot see the edge of your screen (e.g. on a TV) increase the safe area padding. Covers popups/tooltips as well regular windows.
    MouseCursorScale        = 1.0f;             // Scale software rendered mouse cursor (when io.MouseDrawCursor is enabled). May be removed later.
    AntiAliasedLines        = true;             // Enable anti-aliasing on lines/borders. Disable if you are really short on CPU/GPU.
    AntiAliasedFill         = true;             // Enable anti-aliasing on filled shapes (rounded rectangles, circles, etc.)
    CurveTessellationTol    = 1.25f;            // Tessellation tolerance when using PathBezierCurveTo() without a specific number of segments. Decrease for highly tessellated curves (higher quality, more polygons), increase to reduce quality.

    // Default theme
    ImGui::StyleColorsDark(this);
}